

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec_reporter.h
# Opt level: O0

void __thiscall bandit::detail::spec_reporter::it_succeeded(spec_reporter *this,char *desc)

{
  ostream *poVar1;
  char *pcVar2;
  char *desc_local;
  spec_reporter *this_local;
  
  progress_reporter::it_succeeded(&this->super_progress_reporter,desc);
  poVar1 = this->stm_;
  pcVar2 = colorizer::green(this->colorizer_);
  std::operator<<(poVar1,pcVar2);
  std::operator<<(this->stm_,"OK");
  poVar1 = this->stm_;
  pcVar2 = colorizer::reset(this->colorizer_);
  std::operator<<(poVar1,pcVar2);
  std::ostream::operator<<(this->stm_,std::endl<char,std::char_traits<char>>);
  std::ostream::flush();
  return;
}

Assistant:

virtual void it_succeeded(const char* desc)
    {
      progress_reporter::it_succeeded(desc);
      stm_ << colorizer_.green();
	  stm_ << "OK";
	  stm_ << colorizer_.reset();
	  stm_ << std::endl;
      stm_.flush();
    }